

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void isDate(char *attrName,char *str)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  int iVar7;
  ulong in_RCX;
  uint unaff_EBP;
  char *pcVar8;
  ulong uStack_50;
  
  sVar6 = strlen(str);
  if ((((sVar6 == 0x13) && (str[4] == ':')) && (str[7] == ':')) &&
     (((str[10] == ' ' && (str[0xd] == ':')) && (str[0x10] == ':')))) {
    uVar1 = strToInt(str,4);
    uVar2 = strToInt(str + 5,2);
    unaff_EBP = strToInt(str + 8,2);
    uVar3 = strToInt(str + 0xb,2);
    uVar4 = strToInt(str + 0xe,2);
    uVar5 = strToInt(str + 0x11,2);
    pcVar8 = (char *)(ulong)uVar1;
    if (((uVar5 < 0x3c) && (uVar4 < 0x3c)) &&
       ((uVar3 < 0x18 && (((0 < (int)unaff_EBP && (-1 < (int)uVar1)) && (0xfffffff3 < uVar2 - 0xd)))
        ))) {
      if (uVar2 < 0xc) {
        if ((0xa50U >> (uVar2 & 0x1f) & 1) != 0) {
          if (unaff_EBP < 0x1f) {
            return;
          }
          goto LAB_00103b64;
        }
        if (uVar2 == 2) {
          if ((uVar1 & 3) == 0) {
            iVar7 = 0;
            if (uVar1 % 100 == 0) goto LAB_00103b6e;
            uStack_50 = 0x1d;
            goto LAB_00103b60;
          }
          uStack_50 = 0x1c;
          goto LAB_00103b60;
        }
      }
      if (unaff_EBP < 0x20) {
        return;
      }
    }
  }
LAB_00103b64:
  do {
    iVar7 = (int)in_RCX;
    pcVar8 = attrName;
    notValidDate(attrName);
LAB_00103b6e:
    uStack_50 = (ulong)(iVar7 + 0x1c + (uint)((int)(((ulong)pcVar8 & 0xffffffff) % 400) == 0));
LAB_00103b60:
    in_RCX = uStack_50;
  } while ((uint)uStack_50 < unaff_EBP);
  return;
}

Assistant:

void
isDate (const char attrName[], const char str[])
{
    //
    // Check that str represents a valid
    // date of the form YYYY:MM:DD hh:mm:ss.
    //

    if (strlen (str) != 19 || str[4] != ':' || str[7] != ':' ||
        str[10] != ' ' || str[13] != ':' || str[16] != ':')
    {
        notValidDate (attrName);
    }

    int Y = strToInt (str + 0, 4);  // year
    int M = strToInt (str + 5, 2);  // month
    int D = strToInt (str + 8, 2);  // day
    int h = strToInt (str + 11, 2); // hour
    int m = strToInt (str + 14, 2); // minute
    int s = strToInt (str + 17, 2); // second

    if (Y < 0 || M < 1 || M > 12 || D < 1 || h < 0 || h > 23 || m < 0 ||
        m > 59 || s < 0 || s > 59)
    {
        notValidDate (attrName);
    }

    if (M == 2)
    {
        bool leapYear = (Y % 4 == 0) && (Y % 100 != 0 || Y % 400 == 0);

        if (D > (leapYear ? 29 : 28)) notValidDate (attrName);
    }
    else if (M == 4 || M == 6 || M == 9 || M == 11)
    {
        if (D > 30) notValidDate (attrName);
    }
    else
    {
        if (D > 31) notValidDate (attrName);
    }
}